

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmAreaAverageRgb.cpp
# Opt level: O3

QString * __thiscall
AlgorithmAreaAverageRgb::GetDescription
          (QString *__return_storage_ptr__,AlgorithmAreaAverageRgb *this)

{
  QByteArrayView QVar1;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  QVar1.m_data = (storage_type *)0x15c;
  QVar1.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar1);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString AlgorithmAreaAverageRgb::GetDescription()
{
    return "<p>Averages the colour in two zones in the RGB image and compares "
           "the average colour in the same zones in the target "
           "image. Then  pixels are swapped between the zones to minimise RGB "
           "colour error</p>"
           "<p>Error is the sum of the difference between each of the red, "
           "green, & blue colour channels, for both pixels, when compared to "
           "the target image.</p>";
}